

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmove_s.c
# Opt level: O2

errno_t memmove_s(void *s1,rsize_t s1max,void *s2,rsize_t n)

{
  undefined1 uVar1;
  long lVar2;
  long lVar3;
  errno_t eVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  
  if ((((s1max < n) || (s1 == (void *)0x0)) || (s2 == (void *)0x0)) || ((long)(n | s1max) < 0)) {
    if (-1 < (long)s1max && s1 != (void *)0x0) {
      memset(s1,0,s1max);
    }
    eVar4 = 0x16;
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  }
  else {
    puVar5 = (undefined1 *)s1;
    puVar6 = (undefined1 *)s2;
    for (lVar2 = -n; lVar2 != 0; lVar2 = lVar2 + 1) {
      if ((puVar5 == (undefined1 *)s2) || (puVar6 == (undefined1 *)s1)) {
        for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + -1) {
          *(undefined1 *)((long)s1 + lVar3 + (n - 1)) = *(undefined1 *)((long)s2 + lVar3 + (n - 1));
        }
        return 0;
      }
      uVar1 = *puVar6;
      puVar6 = puVar6 + 1;
      *puVar5 = uVar1;
      puVar5 = puVar5 + 1;
    }
    eVar4 = 0;
  }
  return eVar4;
}

Assistant:

errno_t memmove_s( void * s1, rsize_t s1max, const void * s2, rsize_t n )
{
    char * dest = ( char * ) s1;
    const char * src = ( const char * ) s2;

    if ( s1 == NULL || s2 == NULL || s1max > RSIZE_MAX || n > RSIZE_MAX || n > s1max )
    {
        if ( s1 != NULL && s1max <= RSIZE_MAX )
        {
            memset( s1, 0, s1max );
        }

        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return _PDCLIB_EINVAL;
    }

    while ( n )
    {
        if ( dest == s2 || src == s1 )
        {
            src += n;
            dest += n;

            while ( n-- )
            {
                *--dest = *--src;
            }

            return 0;
        }

        *dest++ = *src++;
        --n;
    }

    return 0;
}